

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

void __thiscall Company::gift(Company *this)

{
  Employee *this_00;
  int iVar1;
  string *psVar2;
  long lVar3;
  
  iVar1 = Boss::getNumberOfEmployee(this->boss);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      psVar2 = Person::getId_abi_cxx11_(&this->employee[lVar3]->super_Person);
      if (*(psVar2->_M_dataplus)._M_p == '8') {
        this_00 = this->employee[lVar3];
        iVar1 = Employee::getHourWork(this_00);
        Employee::setHourWork(this_00,iVar1 + 5);
      }
      lVar3 = lVar3 + 1;
      iVar1 = Boss::getNumberOfEmployee(this->boss);
    } while (lVar3 < iVar1);
  }
  return;
}

Assistant:

void Company::gift() {

    int i = 0;
    while(i < boss->getNumberOfEmployee())
    {
        if (employee[i]->getId()[0] == '8'){
            employee[i]->setHourWork((5 + employee[i]->getHourWork()));
        }
        i++;
    }
}